

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  XmlWriter *this_00;
  string *psVar1;
  XmlWriter *pXVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pMVar4;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  OfType OVar8;
  pointer pMVar9;
  long in_FS_OFFSET;
  StringRef local_a8;
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  string local_58;
  ostream *local_38;
  
  local_38 = *(ostream **)(in_FS_OFFSET + 0x28);
  iVar7 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[5])();
  bVar6 = true;
  if (((char)iVar7 == '\0') &&
     ((OVar8 = (assertionStats->assertionResult).m_resultData.resultType, (OVar8 & FailureBit) == Ok
      || (((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)))) {
    if (OVar8 != Warning) goto LAB_0017419c;
    bVar6 = false;
  }
  pMVar9 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar4 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar9 != pMVar4) {
    psVar1 = (string *)(local_78 + 0x20);
    do {
      if (pMVar9->type == Info && bVar6) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>(psVar1,"Info","");
        XmlWriter::scopedElement((XmlWriter *)local_78,(string *)&this->m_xml,(XmlFormatting)psVar1)
        ;
        XmlWriter::writeText((XmlWriter *)local_78._0_8_,&pMVar9->message,Newline|Indent);
LAB_00173c76:
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
      }
      else if (pMVar9->type == Warning) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>(psVar1,"Warning","");
        XmlWriter::scopedElement((XmlWriter *)local_78,(string *)&this->m_xml,(XmlFormatting)psVar1)
        ;
        XmlWriter::writeText((XmlWriter *)local_78._0_8_,&pMVar9->message,Newline|Indent);
        goto LAB_00173c76;
      }
      pMVar9 = pMVar9 + 1;
    } while (pMVar9 != pMVar4);
  }
  OVar8 = (assertionStats->assertionResult).m_resultData.resultType;
  if (!(bool)(bVar6 | OVar8 == Warning)) goto LAB_0017419c;
  if ((assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) {
    paVar3 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_78 + 0x20),"Expression","");
    this_00 = &this->m_xml;
    XmlWriter::startElement(this_00,(string *)(local_78 + 0x20),Newline|Indent);
    pXVar2 = (XmlWriter *)(local_78 + 0x10);
    local_78._0_8_ = pXVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"success","");
    XmlWriter::writeAttribute
              (this_00,(string *)local_78,
               ((assertionStats->assertionResult).m_resultData.resultType & FailureBit) == Ok);
    local_98._0_8_ = (XmlWriter *)(local_98 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"type","");
    local_a8.m_start = (assertionStats->assertionResult).m_info.macroName.m_start;
    local_a8.m_size = (assertionStats->assertionResult).m_info.macroName.m_size;
    XmlWriter::writeAttribute<Catch::StringRef>(this_00,(string *)local_98,&local_a8);
    if ((XmlWriter *)local_98._0_8_ != (XmlWriter *)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_);
    }
    if ((XmlWriter *)local_78._0_8_ != pXVar2) {
      operator_delete((void *)local_78._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar3) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    local_58._M_dataplus._M_p = (assertionStats->assertionResult).m_info.lineInfo.file;
    local_58._M_string_length = (assertionStats->assertionResult).m_info.lineInfo.line;
    writeSourceInfo(this,(SourceLineInfo *)(local_78 + 0x20));
    local_58._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_78 + 0x20),"Original","");
    XmlWriter::scopedElement((XmlWriter *)local_98,(string *)this_00,(int)local_78 + 0x20);
    AssertionResult::getExpression_abi_cxx11_((string *)local_78,&assertionStats->assertionResult);
    XmlWriter::writeText((XmlWriter *)local_98._0_8_,(string *)local_78,Newline|Indent);
    if ((XmlWriter *)local_78._0_8_ != pXVar2) {
      operator_delete((void *)local_78._0_8_);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar3) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    local_58._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_78 + 0x20),"Expanded","");
    XmlWriter::scopedElement((XmlWriter *)local_98,(string *)this_00,(int)local_78 + 0x20);
    AssertionResult::getExpandedExpression_abi_cxx11_
              ((string *)local_78,&assertionStats->assertionResult);
    XmlWriter::writeText((XmlWriter *)local_98._0_8_,(string *)local_78,Newline|Indent);
    if ((XmlWriter *)local_78._0_8_ != pXVar2) {
      operator_delete((void *)local_78._0_8_);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar3) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    OVar8 = (assertionStats->assertionResult).m_resultData.resultType;
  }
  if (OVar8 < ThrewException) {
    if (OVar8 == Info) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_78 + 0x20),"Info","");
      XmlWriter::scopedElement((XmlWriter *)local_98,(string *)&this->m_xml,(int)local_78 + 0x20);
      pcVar5 = (assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
      local_78._0_8_ = (XmlWriter *)(local_78 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,pcVar5,
                 pcVar5 + (assertionStats->assertionResult).m_resultData.message._M_string_length);
      XmlWriter::writeText((XmlWriter *)local_98._0_8_,(string *)local_78,Newline|Indent);
      if ((XmlWriter *)local_78._0_8_ != (XmlWriter *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_);
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
    }
    else if (OVar8 == ExplicitFailure) {
      paVar3 = &local_58.field_2;
      local_58._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_78 + 0x20),"Failure","");
      XmlWriter::startElement(&this->m_xml,(string *)(local_78 + 0x20),Newline|Indent);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar3) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      local_58._M_dataplus._M_p = (assertionStats->assertionResult).m_info.lineInfo.file;
      local_58._M_string_length = (assertionStats->assertionResult).m_info.lineInfo.line;
      writeSourceInfo(this,(SourceLineInfo *)(local_78 + 0x20));
      pcVar5 = (assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
      local_58._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_78 + 0x20),pcVar5,
                 pcVar5 + (assertionStats->assertionResult).m_resultData.message._M_string_length);
      XmlWriter::writeText(&this->m_xml,(string *)(local_78 + 0x20),Newline|Indent);
      goto LAB_00174165;
    }
  }
  else {
    if (OVar8 == FatalErrorCondition) {
      paVar3 = &local_58.field_2;
      local_58._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_78 + 0x20),"FatalErrorCondition","");
      XmlWriter::startElement(&this->m_xml,(string *)(local_78 + 0x20),Newline|Indent);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar3) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      local_58._M_dataplus._M_p = (assertionStats->assertionResult).m_info.lineInfo.file;
      local_58._M_string_length = (assertionStats->assertionResult).m_info.lineInfo.line;
      writeSourceInfo(this,(SourceLineInfo *)(local_78 + 0x20));
      pcVar5 = (assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
      local_58._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_78 + 0x20),pcVar5,
                 pcVar5 + (assertionStats->assertionResult).m_resultData.message._M_string_length);
      XmlWriter::writeText(&this->m_xml,(string *)(local_78 + 0x20),Newline|Indent);
    }
    else {
      if (OVar8 != ThrewException) goto LAB_00174181;
      paVar3 = &local_58.field_2;
      local_58._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_78 + 0x20),"Exception","");
      XmlWriter::startElement(&this->m_xml,(string *)(local_78 + 0x20),Newline|Indent);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar3) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      local_58._M_dataplus._M_p = (assertionStats->assertionResult).m_info.lineInfo.file;
      local_58._M_string_length = (assertionStats->assertionResult).m_info.lineInfo.line;
      writeSourceInfo(this,(SourceLineInfo *)(local_78 + 0x20));
      pcVar5 = (assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
      local_58._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_78 + 0x20),pcVar5,
                 pcVar5 + (assertionStats->assertionResult).m_resultData.message._M_string_length);
      XmlWriter::writeText(&this->m_xml,(string *)(local_78 + 0x20),Newline|Indent);
    }
LAB_00174165:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    XmlWriter::endElement(&this->m_xml,Newline|Indent);
  }
LAB_00174181:
  if ((assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) {
    XmlWriter::endElement(&this->m_xml,Newline|Indent);
  }
LAB_0017419c:
  if (*(ostream **)(in_FS_OFFSET + 0x28) == local_38) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool XmlReporter::assertionEnded( AssertionStats const& assertionStats ) {

        AssertionResult const& result = assertionStats.assertionResult;

        bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

        if( includeResults || result.getResultType() == ResultWas::Warning ) {
            // Print any info messages in <Info> tags.
            for( auto const& msg : assertionStats.infoMessages ) {
                if( msg.type == ResultWas::Info && includeResults ) {
                    m_xml.scopedElement( "Info" )
                            .writeText( msg.message );
                } else if ( msg.type == ResultWas::Warning ) {
                    m_xml.scopedElement( "Warning" )
                            .writeText( msg.message );
                }
            }
        }

        // Drop out if result was successful but we're not printing them.
        if( !includeResults && result.getResultType() != ResultWas::Warning )
            return true;

        // Print the expression if there is one.
        if( result.hasExpression() ) {
            m_xml.startElement( "Expression" )
                .writeAttribute( "success", result.succeeded() )
                .writeAttribute( "type", result.getTestMacroName() );

            writeSourceInfo( result.getSourceInfo() );

            m_xml.scopedElement( "Original" )
                .writeText( result.getExpression() );
            m_xml.scopedElement( "Expanded" )
                .writeText( result.getExpandedExpression() );
        }

        // And... Print a result applicable to each result type.
        switch( result.getResultType() ) {
            case ResultWas::ThrewException:
                m_xml.startElement( "Exception" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::FatalErrorCondition:
                m_xml.startElement( "FatalErrorCondition" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::Info:
                m_xml.scopedElement( "Info" )
                    .writeText( result.getMessage() );
                break;
            case ResultWas::Warning:
                // Warning will already have been written
                break;
            case ResultWas::ExplicitFailure:
                m_xml.startElement( "Failure" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            default:
                break;
        }

        if( result.hasExpression() )
            m_xml.endElement();

        return true;
    }